

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::EvalContext::createLocal(EvalContext *this,ValueSymbol *symbol,ConstantValue *value)

{
  bool bVar1;
  mapped_type *pmVar2;
  ConstantValue *in_RDX;
  map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  *in_RSI;
  ConstantValue *in_RDI;
  ConstantValue *result;
  Type *in_stack_ffffffffffffffb8;
  ConstantValue *__k;
  
  __k = in_RDX;
  SmallVectorBase<slang::ast::EvalContext::Frame>::back
            ((SmallVectorBase<slang::ast::EvalContext::Frame> *)(in_RDI + 2));
  pmVar2 = std::
           map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
           ::operator[](in_RSI,(key_type *)__k);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x60741c);
  if (bVar1) {
    slang::ConstantValue::operator=(in_RDI,in_RDX);
  }
  else {
    ValueSymbol::getType((ValueSymbol *)0x60742a);
    Type::getDefaultValue(in_stack_ffffffffffffffb8);
    slang::ConstantValue::operator=(in_RDI,in_RDX);
    slang::ConstantValue::~ConstantValue((ConstantValue *)0x607450);
  }
  return pmVar2;
}

Assistant:

ConstantValue* EvalContext::createLocal(const ValueSymbol* symbol, ConstantValue value) {
    SLANG_ASSERT(!stack.empty());
    ConstantValue& result = stack.back().temporaries[symbol];
    if (!value) {
        result = symbol->getType().getDefaultValue();
    }
    else {
        SLANG_ASSERT(!value.isInteger() ||
                     value.integer().getBitWidth() == symbol->getType().getBitWidth());

        result = std::move(value);
    }

    return &result;
}